

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O3

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::__updateHashValue
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  _Elt_pointer puVar4;
  byte *pbVar5;
  pointer pCVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  this->hashvalue = 0;
  ppuVar1 = (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar4 = (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->ngram).
                        super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) - (long)puVar2));
  if (puVar4 != (_Elt_pointer)0x0) {
    pCVar6 = (this->hashers).
             super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)puVar2 -
            (long)(this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_first;
    puVar4 = puVar4 + (puVar4 == (_Elt_pointer)0x0);
    lVar8 = 0;
    uVar9 = 0;
    do {
      if ((long)uVar7 < 0) {
        uVar10 = (long)uVar7 >> 9;
LAB_00109a52:
        pbVar5 = ppuVar3[uVar10] + uVar7 + uVar10 * -0x200;
      }
      else {
        if (0x1ff < uVar7) {
          uVar10 = uVar7 >> 9;
          goto LAB_00109a52;
        }
        pbVar5 = puVar2 + lVar8;
      }
      uVar9 = uVar9 ^ pCVar6->hashvalues[*pbVar5];
      this->hashvalue = uVar9;
      lVar8 = lVar8 + 1;
      pCVar6 = pCVar6 + 1;
      uVar7 = uVar7 + 1;
      puVar4 = puVar4 + -1;
    } while (puVar4 != (_Elt_pointer)0x0);
  }
  return;
}

Assistant:

void __updateHashValue() {
    hashvalue = 0;
    for (size_t k = 0; k < ngram.size(); ++k) {
      hashvalue ^= hashers[k].hashvalues[ngram[k]];
    }
  }